

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_1c;
  int res;
  int num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0;
  _res = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");
    iVar1 = __isoc99_scanf("%d",&local_1c);
    if ((iVar1 == 1) && ((local_1c == 0x14 || ((4 < local_1c && (local_1c < 0x10)))))) break;
    if (iVar1 == -1) {
      printf("\n");
      return 0;
    }
    printf("The number you entered is not valid!\n");
    if (iVar1 == 0) {
      __isoc99_scanf("%*[^\n]");
    }
  }
  printf("Good human!\n");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int num = 0;

  while (true) {
    printf("Please enter a non-zero number from 5 to 15 or 20: ");

    const int res = scanf("%d", &num);
    if (res == 1 && (num == 20 || (num >= 5 && num <= 15))) break;
    else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("The number you entered is not valid!\n");
      if (res == 0) scanf("%*[^\n]");
    }
  }

  printf("Good human!\n");

  return 0;
}